

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_state.c
# Opt level: O2

void run_scheduling_stack_fcn(__cilkrts_worker *w)

{
  local_state *plVar1;
  full_frame *pfVar2;
  scheduling_stack_fcn_t p_Var3;
  __cilkrts_stack_frame *p_Var4;
  char *pcVar5;
  undefined8 uStack_10;
  
  plVar1 = w->l;
  pfVar2 = plVar1->frame_ff;
  p_Var3 = plVar1->post_suspend;
  p_Var4 = plVar1->suspended_stack;
  plVar1->frame_ff = (full_frame *)0x0;
  plVar1->post_suspend = (scheduling_stack_fcn_t)0x0;
  plVar1->suspended_stack = (__cilkrts_stack_frame *)0x0;
  if (p_Var3 == (scheduling_stack_fcn_t)0x0) {
    pcVar5 = "fcn";
    uStack_10 = 0x46;
  }
  else if (pfVar2 == (full_frame *)0x0) {
    pcVar5 = "ff2";
    uStack_10 = 0x47;
  }
  else {
    (*p_Var3)(w,pfVar2,p_Var4);
    if (w->l->frame_ff == (full_frame *)0x0) {
      return;
    }
    pcVar5 = "NULL == w->l->frame_ff";
    uStack_10 = 0x4c;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/local_state.c"
                ,uStack_10,pcVar5);
}

Assistant:

void run_scheduling_stack_fcn(__cilkrts_worker *w)
{
    scheduling_stack_fcn_t fcn = w->l->post_suspend;
    full_frame *ff2 = w->l->frame_ff;
    __cilkrts_stack_frame *sf2 = w->l->suspended_stack;

    w->l->post_suspend = 0;
    w->l->suspended_stack = 0;

    // Conceptually, after clearing w->l->frame_ff,
    // w no longer owns the full frame ff.
    // The next time another (possibly different) worker takes
    // ownership of ff will be at a provably_good_steal on ff. 
    w->l->frame_ff = NULL;

    CILK_ASSERT(fcn);
    CILK_ASSERT(ff2);
    fcn(w, ff2, sf2);

    // After we run the scheduling stack function, we shouldn't
    // (still) not have a full frame.
    CILK_ASSERT(NULL == w->l->frame_ff);
}